

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::Schedule(TimerMgr *this,milliseconds *now)

{
  _func_int **pp_Var1;
  milliseconds mVar2;
  __int_type_conflict2 _Var3;
  memory_order mVar4;
  __int_type_conflict2 _Var5;
  Ptr *pPVar6;
  element_type *peVar7;
  atomic_uint *paVar8;
  bool bVar9;
  id local_e0 [3];
  bool local_c1;
  __int_type_conflict2 local_c0;
  __int_type_conflict2 _Stack_bc;
  bool ok;
  uint setv;
  uint expected;
  int local_ac;
  undefined1 local_a8 [8];
  Ptr tmp;
  milliseconds *now_local;
  TimerMgr *this_local;
  bool local_51;
  
  tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)now;
  std::mutex::lock(&this->mtx);
  do {
    if (this->elements_size == 0) break;
    pPVar6 = top(this);
    std::shared_ptr<hwnet::util::Timer>::shared_ptr
              ((shared_ptr<hwnet::util::Timer> *)local_a8,pPVar6);
    peVar7 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    if ((tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base < (_func_int **)peVar7->mExpiredTime) {
      local_ac = 3;
    }
    else {
      _setv = std::this_thread::get_id();
      peVar7 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      (peVar7->tid)._M_thread = _setv;
      _Stack_bc = 0;
      local_c0 = 4;
      peVar7 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      _Var3 = local_c0;
      paVar8 = &peVar7->mStatus;
      mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
      switch(0x15f19b) {
      default:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        break;
      case 2:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        break;
      case 3:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        break;
      case 4:
        if (mVar4 - memory_order_consume < 2) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else if (mVar4 == memory_order_seq_cst) {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
        else {
          LOCK();
          _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
          local_51 = _Stack_bc == _Var5;
          if (local_51) {
            (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
            _Var5 = _Stack_bc;
          }
          UNLOCK();
          if (!local_51) {
            _Stack_bc = _Var5;
          }
        }
      }
      local_c1 = local_51;
      pop(this);
      std::mutex::unlock(&this->mtx);
      if ((local_c1 & 1U) != 0) {
        peVar7 = std::
                 __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_a8);
        Timer::operator()(peVar7);
      }
      std::mutex::lock(&this->mtx);
      if (((local_c1 & 1U) != 0) &&
         (peVar7 = std::
                   __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a8), (peVar7->mOnce & 1U) == 0)) {
        _Stack_bc = 4;
        local_c0 = 0;
        peVar7 = std::
                 __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a8);
        _Var3 = local_c0;
        paVar8 = &peVar7->mStatus;
        mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
        switch(0x15f85b) {
        default:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          break;
        case 2:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          break;
        case 3:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          break;
        case 4:
          if (mVar4 - memory_order_consume < 2) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else if (mVar4 == memory_order_seq_cst) {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
          else {
            LOCK();
            _Var5 = (paVar8->super___atomic_base<unsigned_int>)._M_i;
            bVar9 = _Stack_bc == _Var5;
            if (bVar9) {
              (paVar8->super___atomic_base<unsigned_int>)._M_i = _Var3;
              _Var5 = _Stack_bc;
            }
            UNLOCK();
            if (!bVar9) {
              _Stack_bc = _Var5;
            }
          }
        }
        if (bVar9) {
          if (this->policy == 1) {
            pp_Var1 = (tmp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base;
            peVar7 = std::
                     __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            mVar2 = peVar7->mTimeout;
            peVar7 = std::
                     __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            peVar7->mExpiredTime = (long)pp_Var1 + mVar2;
          }
          else {
            peVar7 = std::
                     __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            mVar2 = peVar7->mTimeout;
            peVar7 = std::
                     __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            peVar7->mExpiredTime = mVar2 + peVar7->mExpiredTime;
          }
          insert(this,(Ptr *)local_a8);
          std::thread::id::id(local_e0);
          peVar7 = std::
                   __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a8);
          (peVar7->tid)._M_thread = local_e0[0]._M_thread;
          local_ac = 2;
          goto LAB_0015fdee;
        }
      }
      peVar7 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
                (&peVar7->mCallback,(nullptr_t)0x0);
      local_ac = 0;
    }
LAB_0015fdee:
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_a8);
  } while ((local_ac == 0) || (local_ac == 2));
  std::mutex::unlock(&this->mtx);
  return;
}

Assistant:

void TimerMgr::Schedule(const milliseconds &now) {
	this->mtx.lock();
    while (this->elements_size > 0) {
        auto tmp = top();
        if (tmp->mExpiredTime > now){
            break;
        }

       	tmp->tid = std::this_thread::get_id(); 
		uint expected = 0;
		uint setv = Timer::incallback;
		auto ok = tmp->mStatus.compare_exchange_strong(expected,setv);
        pop();

        this->mtx.unlock();
		
		if(ok) {
			(*tmp)();
		}

        this->mtx.lock();

        if(ok && !tmp->mOnce) {
        	expected = Timer::incallback;
        	setv = 0;
        	if(tmp->mStatus.compare_exchange_strong(expected,setv)) {
				if(this->policy == TimerMgr::normal) {
					tmp->mExpiredTime = now + tmp->mTimeout;
				} else {
	        		tmp->mExpiredTime += tmp->mTimeout;
	        	}
	        	this->insert(tmp);
	        	tmp->tid = std::thread::id();       
	        	continue; 		
        	}
        }
        tmp->mCallback = nullptr;
    }
    this->mtx.unlock();
}